

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O2

int uv_udp_set_source_membership
              (uv_udp_t *handle,char *multicast_addr,char *interface_addr,char *source_addr,
              uv_membership membership)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  sockaddr_storage *psVar5;
  char *pcVar6;
  undefined8 *puVar7;
  byte bVar8;
  sockaddr_in6 local_24c;
  uint32_t local_230;
  undefined1 auStack_22c [4];
  char local_228 [128];
  undefined8 local_1a8 [16];
  sockaddr_storage src_addr;
  sockaddr_storage mcast_addr;
  
  bVar8 = 0;
  iVar1 = uv_ip4_addr(multicast_addr,0,(sockaddr_in *)&mcast_addr);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr(source_addr,0,(sockaddr_in *)&src_addr);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv__udp_maybe_deferred_bind(handle,2,4);
    if (iVar1 != 0) {
      return iVar1;
    }
    local_228[0] = '\0';
    local_228[1] = '\0';
    local_228[2] = '\0';
    local_228[3] = '\0';
    _local_230 = 0;
    if ((interface_addr != (char *)0x0) &&
       (iVar1 = uv_inet_pton(2,interface_addr,auStack_22c), iVar1 != 0)) {
      return iVar1;
    }
    _local_230 = CONCAT44(auStack_22c,mcast_addr.__ss_padding._2_4_);
    local_228[0] = src_addr.__ss_padding[2];
    local_228[1] = src_addr.__ss_padding[3];
    local_228[2] = src_addr.__ss_padding[4];
    local_228[3] = src_addr.__ss_padding[5];
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x27;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x28;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0,iVar1,&local_230,0xc);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar1 = uv_ip6_addr(multicast_addr,0,(sockaddr_in6 *)&mcast_addr);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv_ip6_addr(source_addr,0,(sockaddr_in6 *)&src_addr);
    if (iVar1 != 0) {
      return iVar1;
    }
    iVar1 = uv__udp_maybe_deferred_bind(handle,10,4);
    if (iVar1 != 0) {
      return iVar1;
    }
    _local_230 = 0;
    if (interface_addr == (char *)0x0) {
      local_24c.sin6_scope_id = 0;
    }
    else {
      iVar1 = uv_ip6_addr(interface_addr,0,&local_24c);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    _local_230 = CONCAT44(auStack_22c,local_24c.sin6_scope_id);
    lVar4 = 0x10;
    psVar5 = &mcast_addr;
    pcVar6 = local_228;
    for (lVar3 = lVar4; lVar3 != 0; lVar3 = lVar3 + -1) {
      *(undefined8 *)pcVar6 = *(undefined8 *)psVar5;
      psVar5 = (sockaddr_storage *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
      pcVar6 = pcVar6 + ((ulong)bVar8 * -2 + 1) * 8;
    }
    psVar5 = &src_addr;
    puVar7 = local_1a8;
    for (; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *(undefined8 *)psVar5;
      psVar5 = (sockaddr_storage *)((long)psVar5 + (ulong)bVar8 * -0x10 + 8);
      puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
    }
    if (membership == UV_JOIN_GROUP) {
      iVar1 = 0x2e;
    }
    else {
      if (membership != UV_LEAVE_GROUP) {
        return -0x16;
      }
      iVar1 = 0x2f;
    }
    iVar1 = setsockopt((handle->io_watcher).fd,0x29,iVar1,&local_230,0x108);
    if (iVar1 == 0) {
      return 0;
    }
  }
  piVar2 = __errno_location();
  return -*piVar2;
}

Assistant:

int uv_udp_set_source_membership(uv_udp_t* handle,
                                 const char* multicast_addr,
                                 const char* interface_addr,
                                 const char* source_addr,
                                 uv_membership membership) {
#if !defined(__OpenBSD__) && !defined(__NetBSD__) && !defined(__ANDROID__)
  int err;
  struct sockaddr_storage mcast_addr;
  struct sockaddr_in* mcast_addr4;
  struct sockaddr_in6* mcast_addr6;
  struct sockaddr_storage src_addr;
  struct sockaddr_in* src_addr4;
  struct sockaddr_in6* src_addr6;

  mcast_addr4 = (struct sockaddr_in*)&mcast_addr;
  mcast_addr6 = (struct sockaddr_in6*)&mcast_addr;
  src_addr4 = (struct sockaddr_in*)&src_addr;
  src_addr6 = (struct sockaddr_in6*)&src_addr;

  err = uv_ip4_addr(multicast_addr, 0, mcast_addr4);
  if (err) {
    err = uv_ip6_addr(multicast_addr, 0, mcast_addr6);
    if (err)
      return err;
    err = uv_ip6_addr(source_addr, 0, src_addr6);
    if (err)
      return err;
    return uv__udp_set_source_membership6(handle,
                                          mcast_addr6,
                                          interface_addr,
                                          src_addr6,
                                          membership);
  }

  err = uv_ip4_addr(source_addr, 0, src_addr4);
  if (err)
    return err;
  return uv__udp_set_source_membership4(handle,
                                        mcast_addr4,
                                        interface_addr,
                                        src_addr4,
                                        membership);
#else
  return UV_ENOSYS;
#endif
}